

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

void __thiscall QLocale::setNumberOptions(QLocale *this,NumberOptions options)

{
  long lVar1;
  QLocalePrivate *pQVar2;
  Int in_ESI;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)
                      CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  (pQVar2->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
  super_QFlagsStorage<QLocale::NumberOption>.i = in_ESI;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLocale::setNumberOptions(NumberOptions options)
{
    d->m_numberOptions = options;
}